

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O1

int sha224_init(hash_state *md)

{
  if (md == (hash_state *)0x0) {
    sha224_init_cold_1();
  }
  (md->sha256).curlen = 0;
  (md->chc).length = 0;
  (md->whirlpool).state[0] = 0x367cd507c1059ed8;
  (md->whirlpool).state[1] = 0xf70e59393070dd17;
  (md->whirlpool).state[2] = 0x68581511ffc00b31;
  (md->whirlpool).state[3] = 0xbefa4fa464f98fa7;
  return 0;
}

Assistant:

int sha224_init(hash_state * md)
{
    LTC_ARGCHK(md != NULL);

    md->sha256.curlen = 0;
    md->sha256.length = 0;
    md->sha256.state[0] = 0xc1059ed8UL;
    md->sha256.state[1] = 0x367cd507UL;
    md->sha256.state[2] = 0x3070dd17UL;
    md->sha256.state[3] = 0xf70e5939UL;
    md->sha256.state[4] = 0xffc00b31UL;
    md->sha256.state[5] = 0x68581511UL;
    md->sha256.state[6] = 0x64f98fa7UL;
    md->sha256.state[7] = 0xbefa4fa4UL;
    return CRYPT_OK;
}